

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

char * __thiscall MeCab::anon_unknown_0::LatticeImpl::toString(LatticeImpl *this,Node *node)

{
  StringBuffer *os;
  char *pcVar1;
  
  os = (this->ostrs_).ptr_;
  if (os == (StringBuffer *)0x0) {
    os = (StringBuffer *)operator_new(0x28);
    os->_vptr_StringBuffer = (_func_int **)&PTR__StringBuffer_00173118;
    os->size_ = 0;
    os->alloc_size_ = 0;
    os->ptr_ = (char *)0x0;
    os->is_delete_ = true;
    os->error_ = false;
    (this->ostrs_).ptr_ = os;
  }
  pcVar1 = toStringInternal(this,node,os);
  return pcVar1;
}

Assistant:

const char *LatticeImpl::toString(const Node *node) {
  return toStringInternal(node, stream());
}